

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O3

void * __thiscall tinyxml2::MemPoolT<72>::Alloc(MemPoolT<72> *this)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  Chunk *__s;
  long lVar4;
  undefined1 auVar5 [16];
  long lVar6;
  
  __s = this->_root;
  if (__s == (Chunk *)0x0) {
    __s = (Chunk *)operator_new(0xfc0);
    lVar4 = 0;
    memset(__s,0,0xfc0);
    DynArray<tinyxml2::MemPoolT<72>::Block_*,_10>::EnsureCapacity
              (&this->_blockPtrs,(this->_blockPtrs)._size + 1);
    iVar1 = (this->_blockPtrs)._size;
    (this->_blockPtrs)._size = iVar1 + 1;
    (this->_blockPtrs)._mem[iVar1] = (Block *)__s;
    auVar3 = _DAT_001e60a0;
    auVar5 = _DAT_001e6090;
    do {
      lVar6 = auVar5._8_8_;
      if (SUB164(auVar5 ^ auVar3,4) == -0x80000000 && SUB164(auVar5 ^ auVar3,0) < -0x7fffffc9) {
        *(Chunk **)((long)__s + lVar4) = __s + auVar5._0_8_ + 1;
        *(Chunk **)((long)__s + lVar4 + 0x48) = __s + lVar6 + 1;
      }
      auVar5._0_8_ = auVar5._0_8_ + 2;
      auVar5._8_8_ = lVar6 + 2;
      lVar4 = lVar4 + 0x90;
    } while (lVar4 != 0xfc0);
    __s[0x37].next = (Chunk *)0x0;
    this->_root = __s;
  }
  this->_root = __s->next;
  iVar2 = this->_currentAllocs;
  iVar1 = iVar2 + 1;
  this->_currentAllocs = iVar1;
  if (this->_maxAllocs <= iVar2) {
    this->_maxAllocs = iVar1;
  }
  this->_nAllocs = this->_nAllocs + 1;
  this->_nUntracked = this->_nUntracked + 1;
  return __s;
}

Assistant:

virtual void* Alloc() {
        if ( !_root ) {
            // Need a new block.
            Block* block = new Block();
            _blockPtrs.Push( block );

            for( int i=0; i<COUNT-1; ++i ) {
                block->chunk[i].next = &block->chunk[i+1];
            }
            block->chunk[COUNT-1].next = 0;
            _root = block->chunk;
        }
        void* result = _root;
        _root = _root->next;

        ++_currentAllocs;
        if ( _currentAllocs > _maxAllocs ) {
            _maxAllocs = _currentAllocs;
        }
        _nAllocs++;
        _nUntracked++;
        return result;
    }